

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_compute(float64 **den,uint32 **den_idx,vector_t *obs,gauden_t *g,uint32 mgau,
                  uint32 **prev_den_idx)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  vector_t pfVar4;
  vector_t *ppfVar5;
  vector_t **pppfVar6;
  float32 *pfVar7;
  vector_t *ppfVar8;
  ulong uVar9;
  uint32 *puVar10;
  float64 *pfVar11;
  ulong uVar12;
  ulong uVar13;
  float64 fVar14;
  double dVar15;
  
  uVar1 = g->n_density;
  uVar2 = g->n_top;
  uVar12 = (ulong)uVar2;
  if (uVar1 < uVar2) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x479,
                  "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                 );
  }
  if (g->fullvar == (vector_t ****)0x0) {
    if (uVar2 == uVar1) {
      if (g->n_feat != 0) {
        uVar13 = 0;
        do {
          uVar9 = 0;
          if ((int)uVar12 != 0) {
            pfVar11 = den[uVar13];
            puVar10 = den_idx[uVar13];
            uVar3 = g->veclen[uVar13];
            pfVar4 = obs[uVar13];
            ppfVar5 = g->mean[mgau][uVar13];
            ppfVar8 = g->var[mgau][uVar13];
            pfVar7 = g->norm[mgau][uVar13];
            uVar9 = 0;
            do {
              fVar14 = log_diag_eval(pfVar4,pfVar7[uVar9],ppfVar5[uVar9],ppfVar8[uVar9],uVar3);
              pfVar11[uVar9] = fVar14;
              puVar10[uVar9] = (uint32)uVar9;
              uVar9 = uVar9 + 1;
            } while (uVar12 != uVar9);
            uVar9 = 0;
            if (g->n_density != 0) {
              uVar12 = 0;
              do {
                dVar15 = exp((double)pfVar11[uVar12]);
                pfVar11 = den[uVar13];
                pfVar11[uVar12] = (float64)dVar15;
                uVar12 = uVar12 + 1;
                uVar9 = (ulong)g->n_density;
              } while (uVar12 < uVar9);
            }
          }
          uVar13 = uVar13 + 1;
          uVar12 = uVar9;
        } while (uVar13 < g->n_feat);
      }
    }
    else {
      if (uVar1 <= uVar2) {
        __assert_fail("g->n_top < g->n_density",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x49e,
                      "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                     );
      }
      if (g->n_feat != 0) {
        uVar13 = 0;
        do {
          if (prev_den_idx == (uint32 **)0x0) {
            puVar10 = (uint32 *)0x0;
          }
          else {
            puVar10 = prev_den_idx[uVar13];
          }
          log_topn_densities(den[uVar13],den_idx[uVar13],(uint32)uVar12,g->n_density,
                             g->veclen[uVar13],obs[uVar13],g->mean[mgau][uVar13],
                             g->var[mgau][uVar13],g->norm[mgau][uVar13],puVar10);
          if (g->n_top == 0) {
            uVar12 = 0;
          }
          else {
            pfVar11 = den[uVar13];
            uVar9 = 0;
            do {
              dVar15 = exp((double)pfVar11[uVar9]);
              pfVar11 = den[uVar13];
              pfVar11[uVar9] = (float64)dVar15;
              uVar9 = uVar9 + 1;
              uVar12 = (ulong)g->n_top;
            } while (uVar9 < uVar12);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < g->n_feat);
      }
    }
  }
  else {
    if (uVar2 != uVar1) {
      __assert_fail("g->n_top == g->n_density",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x47d,
                    "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                   );
    }
    if (g->n_feat != 0) {
      uVar13 = 0;
      do {
        uVar9 = 0;
        if ((int)uVar12 != 0) {
          pfVar11 = den[uVar13];
          puVar10 = den_idx[uVar13];
          uVar3 = g->veclen[uVar13];
          pfVar4 = obs[uVar13];
          ppfVar5 = g->mean[mgau][uVar13];
          pppfVar6 = g->fullvar[mgau][uVar13];
          pfVar7 = g->norm[mgau][uVar13];
          uVar9 = 0;
          do {
            fVar14 = log_full_eval(pfVar4,pfVar7[uVar9],ppfVar5[uVar9],pppfVar6[uVar9],uVar3);
            pfVar11[uVar9] = fVar14;
            puVar10[uVar9] = (uint32)uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
          uVar9 = 0;
          if (g->n_density != 0) {
            pfVar11 = den[uVar13];
            uVar12 = 0;
            do {
              dVar15 = exp((double)pfVar11[uVar12]);
              pfVar11 = den[uVar13];
              pfVar11[uVar12] = (float64)dVar15;
              uVar12 = uVar12 + 1;
              uVar9 = (ulong)g->n_density;
            } while (uVar12 < uVar9);
          }
        }
        uVar13 = uVar13 + 1;
        uVar12 = uVar9;
      } while (uVar13 < g->n_feat);
    }
  }
  return 0;
}

Assistant:

int
gauden_compute(float64 **den,		/* density array for a mixture Gaussian */
	       uint32 **den_idx,	/* density index array for n_top < n_density eval */
	       vector_t *obs,		/* observation vector for some time */
	       gauden_t *g,		/* Gaussian density structure */
	       uint32 mgau,		/* id of the mixture Gau. to evaluate */
	       uint32 **prev_den_idx)   /* Previous frame's top N densities (or NULL) */
{
    uint32 j, k;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    /* Top-N computation not (yet) possible for full covariances */
    if (g->fullvar) {
	assert(g->n_top == g->n_density);
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities_full(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->fullvar[mgau][j],
			       g->norm[mgau][j]);

	    for (k = 0; k < g->n_density; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }
    else if (g->n_top == g->n_density) {
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j]);

	    for (k = 0; k < g->n_density; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }
    else {
	assert(g->n_top < g->n_density);

	for (j = 0; j < g->n_feat; j++) {
	    log_topn_densities(den[j],
			       den_idx[j],
			       g->n_top,
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j],
			       prev_den_idx ? prev_den_idx[j] : NULL);

	    for (k = 0; k < g->n_top; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }


#ifdef GAUDEN_VERBOSE
    gauden_print(stdout,
		 den, den_idx, g,
		 global_map, n_global_map);
#endif

    return S3_SUCCESS;
}